

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  word **this_00;
  bool bVar1;
  Orphan<capnp::Data> *value;
  Reader copyFrom;
  ArrayPtr<const_unsigned_char> AVar2;
  ReaderFor<capnp::Data> RVar3;
  undefined1 local_208 [8];
  Builder root;
  ArrayPtr<const_unsigned_char> local_1d0;
  bool local_1b9;
  undefined1 auStack_1b8 [7];
  bool _kj_shouldLog;
  size_t local_1b0;
  ArrayPtr<const_unsigned_char> local_1a8;
  ArrayPtr<const_unsigned_char> local_198;
  undefined1 local_188 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  TestCase277 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  copyFrom = _::data("foo");
  _kjCondition._48_8_ = copyFrom.super_ArrayPtr<const_unsigned_char>.ptr;
  Orphanage::newOrphanCopy<capnp::Data::Reader>
            ((Orphan<capnp::Data> *)local_120,&local_130,copyFrom);
  local_1a8 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  local_198 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_1a8);
  _auStack_1b8 = (ArrayPtr<const_unsigned_char>)
                 Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_188,
             (DebugExpression<capnp::Data::Reader> *)&local_198,(Reader *)auStack_1b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_1b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b9 != false) {
      AVar2 = (ArrayPtr<const_unsigned_char>)_::data("foo");
      local_1d0 = AVar2;
      RVar3 = Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
      root._builder._32_8_ = RVar3.super_ArrayPtr<const_unsigned_char>.ptr;
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x119,ERROR,
                 "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", _kjCondition, data(\"foo\"), orphan.getReader()"
                 ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_188,
                 (Reader *)&local_1d0,(Reader *)&root._builder.dataSize);
      local_1b9 = false;
    }
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_208,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::Data>>((Orphan<capnp::Data> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField((Builder *)local_208,value);
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}